

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_c.cpp
# Opt level: O0

MockValue_c getMockValueCFromNamedValue(MockNamedValue *namedValue)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined8 extraout_XMM0_Qa;
  MockValue_c MVar4;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50 [2];
  SimpleString local_30;
  MockNamedValue *local_20;
  MockNamedValue *namedValue_local;
  MockValue_c returnValue;
  
  local_20 = namedValue;
  (*namedValue->_vptr_MockNamedValue[0x18])();
  pcVar3 = SimpleString::asCharString(&local_30);
  iVar1 = SimpleString::StrCmp(pcVar3,"bool");
  SimpleString::~SimpleString(&local_30);
  if (iVar1 == 0) {
    namedValue_local._0_4_ = 0;
    uVar2 = (*local_20->_vptr_MockNamedValue[0x19])();
    returnValue.type = (uint)((uVar2 & 1) != 0);
  }
  else {
    (*local_20->_vptr_MockNamedValue[0x18])();
    pcVar3 = SimpleString::asCharString(local_50);
    iVar1 = SimpleString::StrCmp(pcVar3,"int");
    SimpleString::~SimpleString(local_50);
    if (iVar1 == 0) {
      namedValue_local._0_4_ = 2;
      returnValue.type = (*local_20->_vptr_MockNamedValue[0x1a])();
    }
    else {
      (*local_20->_vptr_MockNamedValue[0x18])();
      pcVar3 = SimpleString::asCharString(&local_60);
      iVar1 = SimpleString::StrCmp(pcVar3,"unsigned int");
      SimpleString::~SimpleString(&local_60);
      if (iVar1 == 0) {
        namedValue_local._0_4_ = 1;
        returnValue.type = (*local_20->_vptr_MockNamedValue[0x1b])();
      }
      else {
        (*local_20->_vptr_MockNamedValue[0x18])();
        pcVar3 = SimpleString::asCharString(&local_70);
        iVar1 = SimpleString::StrCmp(pcVar3,"long int");
        SimpleString::~SimpleString(&local_70);
        if (iVar1 == 0) {
          namedValue_local._0_4_ = 3;
          returnValue.type = (*local_20->_vptr_MockNamedValue[0x1c])();
          returnValue._4_4_ = extraout_var;
        }
        else {
          (*local_20->_vptr_MockNamedValue[0x18])();
          pcVar3 = SimpleString::asCharString(&local_80);
          iVar1 = SimpleString::StrCmp(pcVar3,"unsigned long int");
          SimpleString::~SimpleString(&local_80);
          if (iVar1 == 0) {
            namedValue_local._0_4_ = 4;
            returnValue.type = (*local_20->_vptr_MockNamedValue[0x1d])();
            returnValue._4_4_ = extraout_var_00;
          }
          else {
            (*local_20->_vptr_MockNamedValue[0x18])();
            pcVar3 = SimpleString::asCharString(&local_90);
            iVar1 = SimpleString::StrCmp(pcVar3,"long long int");
            SimpleString::~SimpleString(&local_90);
            if (iVar1 == 0) {
              namedValue_local._0_4_ = 5;
              returnValue.type = (*local_20->_vptr_MockNamedValue[0x1e])();
              returnValue._4_4_ = extraout_var_01;
            }
            else {
              (*local_20->_vptr_MockNamedValue[0x18])();
              pcVar3 = SimpleString::asCharString(&local_a0);
              iVar1 = SimpleString::StrCmp(pcVar3,"unsigned long long int");
              SimpleString::~SimpleString(&local_a0);
              if (iVar1 == 0) {
                namedValue_local._0_4_ = 6;
                returnValue.type = (*local_20->_vptr_MockNamedValue[0x1f])();
                returnValue._4_4_ = extraout_var_02;
              }
              else {
                (*local_20->_vptr_MockNamedValue[0x18])();
                pcVar3 = SimpleString::asCharString(&local_b0);
                iVar1 = SimpleString::StrCmp(pcVar3,"double");
                SimpleString::~SimpleString(&local_b0);
                if (iVar1 == 0) {
                  namedValue_local._0_4_ = 7;
                  (*local_20->_vptr_MockNamedValue[0x20])();
                  returnValue._0_8_ = extraout_XMM0_Qa;
                }
                else {
                  (*local_20->_vptr_MockNamedValue[0x18])();
                  pcVar3 = SimpleString::asCharString(&local_c0);
                  iVar1 = SimpleString::StrCmp(pcVar3,"const char*");
                  SimpleString::~SimpleString(&local_c0);
                  if (iVar1 == 0) {
                    namedValue_local._0_4_ = 8;
                    returnValue.type = (*local_20->_vptr_MockNamedValue[0x22])();
                    returnValue._4_4_ = extraout_var_03;
                  }
                  else {
                    (*local_20->_vptr_MockNamedValue[0x18])();
                    pcVar3 = SimpleString::asCharString(&local_d0);
                    iVar1 = SimpleString::StrCmp(pcVar3,"void*");
                    SimpleString::~SimpleString(&local_d0);
                    if (iVar1 == 0) {
                      namedValue_local._0_4_ = 9;
                      returnValue.type = (*local_20->_vptr_MockNamedValue[0x23])();
                      returnValue._4_4_ = extraout_var_04;
                    }
                    else {
                      (*local_20->_vptr_MockNamedValue[0x18])();
                      pcVar3 = SimpleString::asCharString(&local_e0);
                      iVar1 = SimpleString::StrCmp(pcVar3,"const void*");
                      SimpleString::~SimpleString(&local_e0);
                      if (iVar1 == 0) {
                        namedValue_local._0_4_ = 10;
                        returnValue.type = (*local_20->_vptr_MockNamedValue[0x24])();
                        returnValue._4_4_ = extraout_var_05;
                      }
                      else {
                        (*local_20->_vptr_MockNamedValue[0x18])();
                        pcVar3 = SimpleString::asCharString(&local_f0);
                        iVar1 = SimpleString::StrCmp(pcVar3,"void (*)()");
                        SimpleString::~SimpleString(&local_f0);
                        if (iVar1 == 0) {
                          namedValue_local._0_4_ = 0xb;
                          returnValue.type = (*local_20->_vptr_MockNamedValue[0x25])();
                          returnValue._4_4_ = extraout_var_06;
                        }
                        else {
                          (*local_20->_vptr_MockNamedValue[0x18])();
                          pcVar3 = SimpleString::asCharString(&local_100);
                          iVar1 = SimpleString::StrCmp(pcVar3,"const unsigned char*");
                          SimpleString::~SimpleString(&local_100);
                          if (iVar1 == 0) {
                            namedValue_local._0_4_ = 0xc;
                            returnValue.type = (*local_20->_vptr_MockNamedValue[0x26])();
                            returnValue._4_4_ = extraout_var_07;
                          }
                          else {
                            namedValue_local._0_4_ = 0xd;
                            returnValue.type = (*local_20->_vptr_MockNamedValue[0x28])();
                            returnValue._4_4_ = extraout_var_08;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  MVar4._4_4_ = 0;
  MVar4.type = (uint)namedValue_local;
  MVar4.value = (anon_union_8_15_d77b29c0_for_value)returnValue._0_8_;
  return MVar4;
}

Assistant:

static MockValue_c getMockValueCFromNamedValue(const MockNamedValue& namedValue)
{
    MockValue_c returnValue;
    if (SimpleString::StrCmp(namedValue.getType().asCharString(), "bool") == 0) {
        returnValue.type = MOCKVALUETYPE_BOOL;
        returnValue.value.boolValue = namedValue.getBoolValue() ? 1 : 0;
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "int") == 0) {
        returnValue.type = MOCKVALUETYPE_INTEGER;
        returnValue.value.intValue = namedValue.getIntValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "unsigned int") == 0) {
        returnValue.type = MOCKVALUETYPE_UNSIGNED_INTEGER;
        returnValue.value.unsignedIntValue = namedValue.getUnsignedIntValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "long int") == 0) {
        returnValue.type = MOCKVALUETYPE_LONG_INTEGER;
        returnValue.value.longIntValue = namedValue.getLongIntValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "unsigned long int") == 0) {
        returnValue.type = MOCKVALUETYPE_UNSIGNED_LONG_INTEGER;
        returnValue.value.unsignedLongIntValue = namedValue.getUnsignedLongIntValue();
    }
#if CPPUTEST_USE_LONG_LONG
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "long long int") == 0) {
        returnValue.type = MOCKVALUETYPE_LONG_LONG_INTEGER;
        returnValue.value.longLongIntValue = namedValue.getLongLongIntValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "unsigned long long int") == 0) {
        returnValue.type = MOCKVALUETYPE_UNSIGNED_LONG_LONG_INTEGER;
        returnValue.value.unsignedLongLongIntValue = namedValue.getUnsignedLongLongIntValue();
    }
#endif
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "double") == 0) {
        returnValue.type = MOCKVALUETYPE_DOUBLE;
        returnValue.value.doubleValue = namedValue.getDoubleValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "const char*") == 0) {
        returnValue.type = MOCKVALUETYPE_STRING;
        returnValue.value.stringValue = namedValue.getStringValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "void*") == 0) {
        returnValue.type = MOCKVALUETYPE_POINTER;
        returnValue.value.pointerValue = namedValue.getPointerValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "const void*") == 0) {
        returnValue.type = MOCKVALUETYPE_CONST_POINTER;
        returnValue.value.constPointerValue = namedValue.getConstPointerValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "void (*)()") == 0) {
        returnValue.type = MOCKVALUETYPE_FUNCTIONPOINTER;
        returnValue.value.functionPointerValue = (void (*)()) namedValue.getFunctionPointerValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "const unsigned char*") == 0) {
        returnValue.type = MOCKVALUETYPE_MEMORYBUFFER;
        returnValue.value.memoryBufferValue = namedValue.getMemoryBuffer();
    }
    else {
        returnValue.type = MOCKVALUETYPE_OBJECT;
        returnValue.value.objectValue = namedValue.getObjectPointer();
    }